

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.cpp
# Opt level: O1

void __thiscall embree::QuadMesh::updateBuffer(QuadMesh *this,RTCBufferType type,uint slot)

{
  undefined8 *puVar1;
  RawBufferView *pRVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar1 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar2 = (this->vertexAttribs).items;
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX) {
      if (type != RTC_BUFFER_TYPE_INDEX) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"unknown buffer type","");
        *puVar1 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar1 + 1) = 2;
        puVar1[2] = puVar1 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar1 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      if (slot != 0) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"invalid buffer slot","");
        *puVar1 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar1 + 1) = 2;
        puVar1[2] = puVar1 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar1 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      *(int *)&this->field_0x7c = *(int *)&this->field_0x7c + 1;
      this->field_0x80 = 1;
      goto LAB_00a575a3;
    }
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar1 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar2 = &((this->vertices).items)->super_RawBufferView;
  }
  pRVar2[slot].modCounter = pRVar2[slot].modCounter + 1;
  pRVar2[slot].modified = true;
LAB_00a575a3:
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void QuadMesh::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      quads.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX)
    {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
    {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }